

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O0

bool __thiscall ArmParser::parseRegisterList(ArmParser *this,Parser *parser,int *dest,int validMask)

{
  bool bVar1;
  Token *pTVar2;
  int local_94;
  int i;
  undefined1 local_80 [8];
  ArmRegisterValue reg2;
  ArmRegisterValue reg;
  int validMask_local;
  int *dest_local;
  Parser *parser_local;
  ArmParser *this_local;
  
  ArmRegisterValue::ArmRegisterValue((ArmRegisterValue *)&reg2.num);
  ArmRegisterValue::ArmRegisterValue((ArmRegisterValue *)local_80);
  *dest = 0;
  do {
    bVar1 = parseRegister(this,parser,(ArmRegisterValue *)&reg2.num,0xf);
    if (!bVar1) {
      this_local._7_1_ = false;
LAB_001bd067:
      ArmRegisterValue::~ArmRegisterValue((ArmRegisterValue *)local_80);
      ArmRegisterValue::~ArmRegisterValue((ArmRegisterValue *)&reg2.num);
      return this_local._7_1_;
    }
    pTVar2 = Parser::peekToken(parser,0);
    if (pTVar2->type == Minus) {
      Parser::eatToken(parser);
      bVar1 = parseRegister(this,parser,(ArmRegisterValue *)local_80,0xf);
      if ((!bVar1) || ((int)reg2.name._name.field_2._8_4_ < (int)reg.name._name.field_2._8_4_)) {
        this_local._7_1_ = false;
        goto LAB_001bd067;
      }
      for (local_94 = reg.name._name.field_2._8_4_; local_94 <= (int)reg2.name._name.field_2._8_4_;
          local_94 = local_94 + 1) {
        *dest = 1 << ((byte)local_94 & 0x1f) | *dest;
      }
    }
    else {
      *dest = 1 << ((byte)reg.name._name.field_2._8_4_ & 0x1f) | *dest;
    }
    pTVar2 = Parser::peekToken(parser,0);
    if (pTVar2->type != Comma) {
      this_local._7_1_ = (validMask & *dest) == *dest;
      goto LAB_001bd067;
    }
    Parser::eatToken(parser);
  } while( true );
}

Assistant:

bool ArmParser::parseRegisterList(Parser& parser, int& dest, int validMask)
{
	ArmRegisterValue reg, reg2;

	dest = 0;
	while (true)
	{
		if (!parseRegister(parser,reg))
			return false;

		if (parser.peekToken().type == TokenType::Minus)
		{
			parser.eatToken();

			if (!parseRegister(parser,reg2) || reg2.num < reg.num)
				return false;
			
			for (int i = reg.num; i <= reg2.num; i++)
			{
				dest |= (1 << i);
			}
		} else {
			dest |= (1 << reg.num);
		}

		if (parser.peekToken().type != TokenType::Comma)
			break;

		parser.eatToken();
	}

	return (validMask & dest) == dest;
}